

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O2

FT_Error FT_GlyphLoader_CheckPoints(FT_GlyphLoader loader,FT_UInt n_points,FT_UInt n_contours)

{
  uint uVar1;
  ulong uVar2;
  FT_Vector *pFVar3;
  char *pcVar4;
  short *psVar5;
  FT_Memory memory;
  ulong cur_count;
  uint uVar6;
  uint uVar7;
  FT_Error FVar8;
  FT_Error error;
  FT_Memory local_48;
  FT_UInt local_3c;
  ulong local_38;
  
  memory = loader->memory;
  error = 0;
  uVar7 = (int)(loader->base).outline.n_points + n_points + (int)(loader->current).outline.n_points;
  uVar1 = loader->max_points;
  cur_count = (ulong)uVar1;
  if (uVar1 < uVar7) {
    if (0x7fff < uVar7 + 7) {
      return 10;
    }
    uVar6 = uVar7 + 7 & 0xfffffff8;
    local_38 = (ulong)uVar6;
    local_48 = memory;
    local_3c = n_contours;
    pFVar3 = (FT_Vector *)
             ft_mem_realloc(memory,0x10,cur_count,local_38,(loader->base).outline.points,&error);
    (loader->base).outline.points = pFVar3;
    if (error == 0) {
      pcVar4 = (char *)ft_mem_realloc(local_48,1,cur_count,local_38,(loader->base).outline.tags,
                                      &error);
      (loader->base).outline.tags = pcVar4;
      if (error == 0) {
        if (loader->use_extra != '\0') {
          pFVar3 = (FT_Vector *)
                   ft_mem_realloc(local_48,0x10,(ulong)(uVar1 * 2),(ulong)(uVar6 * 2),
                                  (loader->base).extra_points,&error);
          uVar2 = local_38;
          (loader->base).extra_points = pFVar3;
          if (error != 0) goto LAB_001327c9;
          memmove(pFVar3 + local_38,pFVar3 + cur_count,cur_count * 0x10);
          (loader->base).extra_points2 = (loader->base).extra_points + uVar2;
        }
        loader->max_points = uVar6;
        memory = local_48;
        n_contours = local_3c;
        goto LAB_0013277f;
      }
    }
LAB_001327c9:
    FVar8 = error;
    FT_GlyphLoader_Reset(loader);
  }
  else {
LAB_0013277f:
    uVar6 = (int)(loader->base).outline.n_contours + n_contours +
            (int)(loader->current).outline.n_contours;
    if (loader->max_contours < uVar6) {
      uVar6 = uVar6 + 3;
      if (0x7fff < uVar6) {
        return 10;
      }
      uVar6 = uVar6 & 0xfffffffc;
      psVar5 = (short *)ft_mem_realloc(memory,2,(ulong)loader->max_contours,(ulong)uVar6,
                                       (loader->base).outline.contours,&error);
      (loader->base).outline.contours = psVar5;
      if (error != 0) goto LAB_001327c9;
      loader->max_contours = uVar6;
    }
    else if (uVar7 <= uVar1) {
      return 0;
    }
    FT_GlyphLoader_Adjust_Points(loader);
    FVar8 = 0;
  }
  return FVar8;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CheckPoints( FT_GlyphLoader  loader,
                              FT_UInt         n_points,
                              FT_UInt         n_contours )
  {
    FT_Memory    memory  = loader->memory;
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  base    = &loader->base.outline;
    FT_Outline*  current = &loader->current.outline;
    FT_Bool      adjust  = 0;

    FT_UInt      new_max, old_max;


    /* check points & tags */
    new_max = (FT_UInt)base->n_points + (FT_UInt)current->n_points +
              n_points;
    old_max = loader->max_points;

    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 8 );

      if ( new_max > FT_OUTLINE_POINTS_MAX )
        return FT_THROW( Array_Too_Large );

      if ( FT_RENEW_ARRAY( base->points, old_max, new_max ) ||
           FT_RENEW_ARRAY( base->tags,   old_max, new_max ) )
        goto Exit;

      if ( loader->use_extra )
      {
        if ( FT_RENEW_ARRAY( loader->base.extra_points,
                             old_max * 2, new_max * 2 ) )
          goto Exit;

        FT_ARRAY_MOVE( loader->base.extra_points + new_max,
                       loader->base.extra_points + old_max,
                       old_max );

        loader->base.extra_points2 = loader->base.extra_points + new_max;
      }

      adjust = 1;
      loader->max_points = new_max;
    }

    /* check contours */
    old_max = loader->max_contours;
    new_max = (FT_UInt)base->n_contours + (FT_UInt)current->n_contours +
              n_contours;
    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 4 );

      if ( new_max > FT_OUTLINE_CONTOURS_MAX )
        return FT_THROW( Array_Too_Large );

      if ( FT_RENEW_ARRAY( base->contours, old_max, new_max ) )
        goto Exit;

      adjust = 1;
      loader->max_contours = new_max;
    }

    if ( adjust )
      FT_GlyphLoader_Adjust_Points( loader );

  Exit:
    if ( error )
      FT_GlyphLoader_Reset( loader );

    return error;
  }